

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

Float __thiscall pbrt::LightBounds::Importance(LightBounds *this,Point3f p,Normal3f n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  float fVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  Float FVar26;
  float fVar27;
  Float radius;
  float local_a8;
  float local_6c;
  undefined1 local_68 [16];
  Tuple3<pbrt::Point3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  undefined8 uStack_20;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  fVar23 = n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar20 = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._8_56_ = p._8_56_;
  auVar17._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_28 = n.super_Tuple3<pbrt::Normal3,_float>.x;
  fStack_24 = n.super_Tuple3<pbrt::Normal3,_float>.y;
  fVar27 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
  fVar16 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  fVar12 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  fVar14 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  fVar15 = (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  fVar1 = (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
  fVar11 = p.super_Tuple3<pbrt::Point3,_float>.x;
  fVar13 = fVar11 - (fVar16 + fVar27) * 0.5;
  local_68 = vmovshdup_avx(auVar17._0_16_);
  fVar2 = local_68._0_4_ - (fVar12 + fVar14) * 0.5;
  fVar3 = fVar20 - (fVar15 + fVar1) * 0.5;
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar13),
                            ZEXT416((uint)fVar13));
  local_38._0_4_ = fVar3;
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  fVar14 = fVar14 - fVar12;
  auVar8 = ZEXT416((uint)(fVar27 - fVar16));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar8,auVar8);
  auVar9 = ZEXT416((uint)(fVar1 - fVar15));
  auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
  uVar24 = auVar25._0_4_;
  uStack_20 = in_XMM2_Qb;
  if (auVar8._0_4_ < 0.0) {
    fVar27 = sqrtf(auVar8._0_4_);
    auVar25 = ZEXT416(uVar24);
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar27 = auVar8._0_4_;
  }
  if (auVar25._0_4_ < 0.0) {
    fVar16 = sqrtf(auVar25._0_4_);
  }
  else {
    auVar25 = vsqrtss_avx(auVar25,auVar25);
    fVar16 = auVar25._0_4_;
  }
  auVar22._0_4_ = fVar13 / fVar16;
  auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar12 = (float)local_38._0_4_ / fVar16;
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((fVar2 / fVar16) *
                                          (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),auVar22,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar12),
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar25,auVar8);
  auVar9._4_12_ = auVar25._4_12_;
  auVar9._0_4_ = (uint)(this->twoSided & 1) * auVar8._0_4_ +
                 (uint)!(bool)(this->twoSided & 1) * auVar25._0_4_;
  auVar25 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar9,auVar9);
  auVar25 = vmaxss_avx(auVar25,ZEXT816(0));
  local_38 = auVar22;
  if (auVar25._0_4_ < 0.0) {
    auVar18._0_4_ = sqrtf(auVar25._0_4_);
    auVar18._4_60_ = extraout_var;
    auVar25 = auVar18._0_16_;
  }
  else {
    auVar25 = vsqrtss_avx(auVar25,auVar25);
  }
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  Bounds3<float>::BoundingSphere(&this->b,(Point3<float> *)&local_58,&local_6c);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_68._0_4_ - local_58.y) *
                                         ((float)local_68._0_4_ - local_58.y))),
                           ZEXT416((uint)(fVar11 - local_58.x)),ZEXT416((uint)(fVar11 - local_58.x))
                          );
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(fVar20 - local_58.z)),
                           ZEXT416((uint)(fVar20 - local_58.z)));
  if (local_6c * local_6c <= auVar8._0_4_) {
    fVar14 = local_58.x - fVar11;
    fVar15 = local_58.y - (float)local_68._0_4_;
    fVar1 = local_58.z - fVar20;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),ZEXT416((uint)fVar14),
                             ZEXT416((uint)fVar14));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    if (auVar8._0_4_ < 0.0) {
      local_48._0_4_ = fVar14;
      fVar13 = sqrtf(auVar8._0_4_);
      fVar14 = (float)local_48._0_4_;
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar13 = auVar8._0_4_;
    }
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)((local_58.y - (float)local_68._0_4_) *
                                           (local_58.y - (float)local_68._0_4_))),
                             ZEXT416((uint)(local_58.x - fVar11)),
                             ZEXT416((uint)(local_58.x - fVar11)));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(local_58.z - fVar20)),
                             ZEXT416((uint)(local_58.z - fVar20)));
    auVar8 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_6c * local_6c) / auVar8._0_4_)),
                        ZEXT816(0) << 0x40);
    if (auVar8._0_4_ < 0.0) {
      local_68._0_4_ = fVar15 / fVar13;
      auVar19._0_4_ = sqrtf(auVar8._0_4_);
      auVar19._4_60_ = extraout_var_00;
      auVar8 = auVar19._0_16_;
      fVar15 = (float)local_68._0_4_;
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar15 = fVar15 / fVar13;
    }
    auVar22 = vfmadd213ss_fma(ZEXT416((uint)(fVar14 / fVar13)),ZEXT416((uint)(fVar14 / fVar13)),
                              ZEXT416((uint)(fVar15 * fVar15)));
    auVar22 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 / fVar13)),ZEXT416((uint)(fVar1 / fVar13)),
                              auVar22);
    if (auVar22._0_4_ < 0.0) {
      sqrtf(auVar22._0_4_);
      auVar8 = ZEXT416(auVar8._0_4_);
    }
  }
  else {
    auVar8 = SUB6416(ZEXT464(0xbf800000),0);
  }
  auVar22 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar8,auVar8);
  auVar10 = ZEXT816(0) << 0x40;
  auVar22 = vmaxss_avx(auVar22,auVar10);
  uVar21 = auVar8._0_4_;
  if (auVar22._0_4_ < 0.0) {
    fVar14 = sqrtf(auVar22._0_4_);
    auVar10 = ZEXT816(0) << 0x40;
  }
  else {
    auVar8 = vsqrtss_avx(auVar22,auVar22);
    fVar14 = auVar8._0_4_;
  }
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  local_68 = vxorps_avx512vl(auVar9,auVar6);
  auVar8 = vfnmadd213ss_fma(ZEXT416((uint)this->cosTheta_o),ZEXT416((uint)this->cosTheta_o),
                            ZEXT416(0x3f800000));
  auVar8 = vmaxss_avx(auVar8,auVar10);
  if (auVar8._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar8._0_4_);
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar15 = auVar8._0_4_;
  }
  FVar26 = this->cosTheta_o;
  local_a8 = auVar25._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * local_a8)),auVar9,ZEXT416((uint)FVar26));
  uVar4 = vcmpss_avx512f(ZEXT416((uint)FVar26),auVar9,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar10._4_12_ = auVar8._4_12_;
  auVar10._0_4_ = (uint)bVar5 * 0x3f800000 + (uint)!bVar5 * auVar8._0_4_;
  auVar8 = vfnmadd213ss_fma(ZEXT416((uint)FVar26),ZEXT416((uint)FVar26),
                            SUB6416(ZEXT464(0x3f800000),0));
  auVar8 = vmaxss_avx(auVar8,ZEXT816(0) << 0x40);
  if (auVar8._0_4_ < 0.0) {
    local_48 = auVar10;
    fVar15 = sqrtf(auVar8._0_4_);
    auVar10 = local_48;
  }
  else {
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar15 = auVar8._0_4_;
  }
  auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)this->cosTheta_o),
                            ZEXT416((uint)(fVar15 * (float)local_68._0_4_)));
  uVar4 = vcmpss_avx512f(ZEXT416((uint)this->cosTheta_o),ZEXT416(auVar9._0_4_),1);
  FVar26 = 0.0;
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (float)((uint)!(bool)((byte)uVar4 & 1) *
                                                           auVar25._0_4_))),auVar10,ZEXT416(uVar21))
  ;
  uVar4 = vcmpss_avx512f(ZEXT416(uVar21),auVar10,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar15 = (float)((uint)bVar5 * 0x3f800000 + (uint)!bVar5 * auVar25._0_4_);
  if (this->cosTheta_e < fVar15) {
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar27 * 0.5)),ZEXT416(uVar24));
    fVar27 = (fVar15 * this->phi) / auVar25._0_4_;
    auVar25._4_4_ = fStack_24;
    auVar25._0_4_ = local_28;
    auVar25._8_8_ = uStack_20;
    auVar25 = vmovshdup_avx(auVar25);
    if ((((local_28 != 0.0) || (NAN(local_28))) || (auVar25._0_4_ != 0.0)) ||
       (((NAN(auVar25._0_4_) || (fVar23 != 0.0)) || (NAN(fVar23))))) {
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 / fVar16)),auVar25,
                                ZEXT416((uint)(fVar12 * fVar23)));
      auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar23),
                               ZEXT416((uint)(fVar12 * fVar23)));
      auVar25 = vfmadd132ss_fma(local_38,ZEXT416((uint)(auVar25._0_4_ + auVar8._0_4_)),
                                ZEXT416((uint)local_28));
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(auVar25,auVar7);
      auVar25 = vfnmadd213ss_fma(auVar8,auVar8,ZEXT416(0x3f800000));
      auVar25 = vmaxss_avx(auVar25,ZEXT816(0) << 0x20);
      if (auVar25._0_4_ < 0.0) {
        fVar16 = sqrtf(auVar25._0_4_);
      }
      else {
        auVar25 = vsqrtss_avx(auVar25,auVar25);
        fVar16 = auVar25._0_4_;
      }
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar16)),auVar8,ZEXT416(uVar21));
      uVar4 = vcmpss_avx512f(ZEXT416(uVar21),auVar8,1);
      bVar5 = (bool)((byte)uVar4 & 1);
      fVar27 = fVar27 * (float)((uint)bVar5 * 0x3f800000 + (uint)!bVar5 * auVar25._0_4_);
    }
    auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar27));
    FVar26 = auVar25._0_4_;
  }
  return FVar26;
}

Assistant:

PBRT_CPU_GPU
    Float Importance(Point3f p, Normal3f n) const {
        // Compute clamped squared distance to _intr_
        Point3f pc = Centroid();
        Float d2 = DistanceSquared(p, pc);
        // Don't let d2 get too small if p is inside the bounds.
        d2 = std::max(d2, Length(b.Diagonal()) / 2);

        Vector3f wi = Normalize(p - pc);

        Float cosTheta = Dot(w, wi);
        if (twoSided)
            cosTheta = std::abs(cosTheta);
#if 0
    else if (cosTheta < 0 && cosTheta_o == 1) {
        // Catch the case where the point is outside the bounds and definitely
        // not in the emitted cone even though the conservative theta_u test
        // make suggest it could be.
        // Doesn't seem to make much difference in practice.
        if ((p.x < b.pMin.x || p.x > b.pMax.x) &&
            (p.y < b.pMin.y || p.y > b.pMax.y) &&
            (p.z < b.pMin.z || p.z > b.pMax.z))
            return 0;
    }
#endif

        // FIXME? unstable when cosTheta \approx 1
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);

        // Define sine and cosine clamped subtraction lambdas
        // cos(max(0, a-b))
        auto cosSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 1;
            return cosThetaA * cosThetaB + sinThetaA * sinThetaB;
        };
        // sin(max(0, a-b))
        auto sinSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 0;
            return sinThetaA * cosThetaB - cosThetaA * sinThetaB;
        };

        // Compute $\cos \theta_\roman{u}$ for _intr_
        Float cosTheta_u = BoundSubtendedDirections(b, p).cosTheta;
        Float sinTheta_u = SafeSqrt(1 - cosTheta_u * cosTheta_u);

        // Compute $\cos \theta_\roman{p}$ for _intr_ and test against $\cos
        // \theta_\roman{e}$
        // cos(theta_p). Compute in two steps
        Float cosTheta_x = cosSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float sinTheta_x = sinSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float cosTheta_p = cosSubClamped(sinTheta_x, cosTheta_x, sinTheta_u, cosTheta_u);
        if (cosTheta_p <= cosTheta_e)
            return 0;

        Float imp = phi * cosTheta_p / d2;
        DCHECK_GE(imp, -1e-3);

        // Account for $\cos \theta_\roman{i}$ in importance at surfaces
        if (n != Normal3f(0, 0, 0)) {
            // cos(thetap_i) = cos(max(0, theta_i - theta_u))
            // cos (a-b) = cos a cos b + sin a sin b
            Float cosTheta_i = AbsDot(wi, n);
            Float sinTheta_i = SafeSqrt(1 - cosTheta_i * cosTheta_i);
            Float cosThetap_i =
                cosSubClamped(sinTheta_i, cosTheta_i, sinTheta_u, cosTheta_u);
            imp *= cosThetap_i;
        }

        return std::max<Float>(imp, 0);
    }